

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  double dVar1;
  PFNGLUNIFORM1IPROC p_Var2;
  int iVar3;
  GLint GVar4;
  GLFWwindow *pGVar5;
  ostream *poVar6;
  size_t sVar7;
  stbi_uc *psVar8;
  long lVar9;
  vec3 *pvVar10;
  tmat4x4<float,_(glm::precision)0> *m;
  float *pfVar11;
  tvec3<float,_(glm::precision)0> *up;
  uint i;
  ulong uVar12;
  byte bVar13;
  float fVar14;
  tvec3<float,_(glm::precision)0> tVar15;
  bool show_another_window;
  int height;
  int width;
  uint VAO;
  uint texture2;
  uint texture1;
  uint VBO;
  int nrChannels;
  GLFWwindow *local_950;
  mat4 model;
  undefined8 local_908;
  undefined4 local_900;
  int nrAttributes;
  float local_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  float fStack_8d0;
  float fStack_8cc;
  float local_8c8;
  float fStack_8c4;
  float fStack_8c0;
  float fStack_8bc;
  mat4 projection;
  Shader shader;
  string local_808;
  string local_7e8;
  mat4 view;
  vec3 cubePositions [10];
  char path [1024];
  float vertices [180];
  
  bVar13 = 0;
  show_another_window = true;
  glfwSetErrorCallback(error_callback);
  iVar3 = glfwInit();
  if (iVar3 == 0) {
    iVar3 = 1;
  }
  else {
    glfwWindowHint(0x22002,3);
    glfwWindowHint(0x22003,3);
    glfwWindowHint(0x22008,0x32001);
    pGVar5 = (GLFWwindow *)glfwCreateWindow(800,600,"ImGui GLFW example 09",0,0);
    glfwMakeContextCurrent(pGVar5);
    glfwSetFramebufferSizeCallback(pGVar5,framebuffer_size_callback);
    glfwSetCursorPosCallback(pGVar5,mouse_callback);
    glfwSetScrollCallback(pGVar5,scroll_callback);
    glfwSetInputMode(pGVar5,0x33001,0x34003);
    gl3wInit();
    (*gl3wEnable)(0xb71);
    (*gl3wGetIntegerv)(0x8869,&nrAttributes);
    poVar6 = std::operator<<((ostream *)&std::cout,"Maximum nr of vertex attributes supported: ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,nrAttributes);
    std::endl<char,std::char_traits<char>>(poVar6);
    local_950 = pGVar5;
    ImGui_ImplGlfwGL3_Init(pGVar5,true);
    getcwd(path,0x3ff);
    shader.mFSsource._M_dataplus._M_p = (pointer)&shader.mFSsource.field_2;
    shader.mFSsource._M_string_length = 0;
    shader.mFSsource.field_2._M_local_buf[0] = '\0';
    shader.mVSsource._M_dataplus._M_p = (pointer)&shader.mVSsource.field_2;
    shader.mVSsource._M_string_length = 0;
    shader.mVSsource.field_2._M_local_buf[0] = '\0';
    shader.mGSsource._M_dataplus._M_p = (pointer)&shader.mGSsource.field_2;
    shader.mGSsource._M_string_length = 0;
    shader.mGSsource.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7e8,path,(allocator<char> *)vertices);
    Shader::loadVS(&shader,&local_7e8);
    std::__cxx11::string::~string((string *)&local_7e8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_808,path,(allocator<char> *)vertices);
    Shader::loadFS(&shader,&local_808);
    std::__cxx11::string::~string((string *)&local_808);
    Shader::build(&shader);
    memcpy(vertices,&DAT_00150550,0x2d0);
    pfVar11 = (float *)&DAT_00150820;
    pvVar10 = cubePositions;
    for (lVar9 = 0x1e; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pvVar10->field_0).field_0.x = *pfVar11;
      pfVar11 = pfVar11 + (ulong)bVar13 * -2 + 1;
      pvVar10 = (vec3 *)((long)pvVar10 + (ulong)bVar13 * -8 + 4);
    }
    (*gl3wGenVertexArrays)(1,&VAO);
    (*gl3wGenBuffers)(1,&VBO);
    (*gl3wBindVertexArray)(VAO);
    (*gl3wBindBuffer)(0x8892,VBO);
    (*gl3wBufferData)(0x8892,0x2d0,vertices,0x88e4);
    (*gl3wVertexAttribPointer)(0,3,0x1406,'\0',0x14,(GLvoid *)0x0);
    (*gl3wEnableVertexAttribArray)(0);
    (*gl3wVertexAttribPointer)(1,2,0x1406,'\0',0x14,(GLvoid *)0xc);
    (*gl3wEnableVertexAttribArray)(1);
    (*gl3wGenTextures)(1,&texture1);
    (*gl3wBindTexture)(0xde1,texture1);
    (*gl3wTexParameteri)(0xde1,0x2802,0x2901);
    (*gl3wTexParameteri)(0xde1,0x2803,0x2901);
    (*gl3wTexParameteri)(0xde1,0x2801,0x2601);
    (*gl3wTexParameteri)(0xde1,0x2800,0x2601);
    stbi__vertically_flip_on_load = 1;
    getcwd(path,0x3ff);
    sVar7 = strlen(path);
    builtin_strncpy(path + sVar7,"/container.jpg",0xf);
    printf("path[%s]\n",path);
    psVar8 = stbi_load(path,&width,&height,&nrChannels,0);
    if (psVar8 == (stbi_uc *)0x0) {
      poVar6 = std::operator<<((ostream *)&std::cout,"Failed to load texture");
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    else {
      (*gl3wTexImage2D)(0xde1,0,0x1907,width,height,0,0x1907,0x1401,psVar8);
      (*gl3wGenerateMipmap)(0xde1);
    }
    free(psVar8);
    (*gl3wGenTextures)(1,&texture2);
    (*gl3wBindTexture)(0xde1,texture2);
    (*gl3wTexParameteri)(0xde1,0x2802,0x2901);
    (*gl3wTexParameteri)(0xde1,0x2803,0x2901);
    (*gl3wTexParameteri)(0xde1,0x2801,0x2601);
    (*gl3wTexParameteri)(0xde1,0x2800,0x2601);
    getcwd(path,0x3ff);
    sVar7 = strlen(path);
    builtin_strncpy(path + sVar7,"/awesomeface.png",0x11);
    printf("path[%s]\n",path);
    up = (tvec3<float,_(glm::precision)0> *)0x0;
    psVar8 = stbi_load(path,&width,&height,&nrChannels,0);
    if (psVar8 == (stbi_uc *)0x0) {
      poVar6 = std::operator<<((ostream *)&std::cout,"Failed to load texture");
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    else {
      up = (tvec3<float,_(glm::precision)0> *)(ulong)(uint)height;
      (*gl3wTexImage2D)(0xde1,0,0x1907,width,height,0,0x1908,0x1401,psVar8);
      (*gl3wGenerateMipmap)(0xde1);
    }
    free(psVar8);
    (*gl3wUseProgram)(shader.pID);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&projection,"texture1",(allocator<char> *)&view);
    p_Var2 = gl3wUniform1i;
    GVar4 = (*gl3wGetUniformLocation)(shader.pID,(GLchar *)projection.value[0].field_0._0_8_);
    (*p_Var2)(GVar4,0);
    std::__cxx11::string::~string((string *)&projection);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&projection,"texture2",(allocator<char> *)&view);
    p_Var2 = gl3wUniform1i;
    GVar4 = (*gl3wGetUniformLocation)(shader.pID,(GLchar *)projection.value[0].field_0._0_8_);
    (*p_Var2)(GVar4,1);
    std::__cxx11::string::~string((string *)&projection);
    pGVar5 = local_950;
    while( true ) {
      iVar3 = glfwWindowShouldClose(pGVar5);
      if (iVar3 != 0) break;
      dVar1 = (double)glfwGetTime();
      deltaTime = (float)dVar1 - lastFrame;
      lastFrame = (float)dVar1;
      processInput(pGVar5);
      ImGui_ImplGlfwGL3_NewFrame();
      if (show_another_window == true) {
        projection.value[0].field_0._0_8_ = 0x42c8000043480000;
        ImGui::SetNextWindowSize((ImVec2 *)&projection,4);
        ImGui::Begin("Another Window",&show_another_window,0);
        ShowAnotherWindow();
        ImGui::End();
      }
      (*gl3wClearColor)(0.2,0.3,0.3,1.0);
      (*gl3wClear)(0x4100);
      (*gl3wActiveTexture)(0x84c0);
      (*gl3wBindTexture)(0xde1,texture1);
      (*gl3wActiveTexture)(0x84c1);
      (*gl3wBindTexture)(0xde1,texture2);
      (*gl3wUseProgram)(shader.pID);
      glm::perspectiveRH<float>
                ((tmat4x4<float,_(glm::precision)0> *)&projection,fov * 0.017453292,1.3333334,0.1,
                 100.0);
      tVar15 = glm::operator+(&cameraPos,&cameraFront);
      model.value[0].field_0.field_0.z = (float)tVar15.field_0._8_4_;
      model.value[0].field_0.field_0.x = tVar15.field_0._0_4_;
      model.value[0].field_0.field_0.y = tVar15.field_0._4_4_;
      pvVar10 = &cameraUp;
      glm::lookAtRH<float,(glm::precision)0>
                (&view,(glm *)&cameraPos,(tvec3<float,_(glm::precision)0> *)&model,&cameraUp,up);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&model,"projection",(allocator<char> *)&local_8f8);
      Shader::setMat4(&shader,(string *)&model,&projection);
      std::__cxx11::string::~string((string *)&model);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&model,"view",(allocator<char> *)&local_8f8);
      Shader::setMat4(&shader,(string *)&model,&view);
      std::__cxx11::string::~string((string *)&model);
      (*gl3wBindVertexArray)(VAO);
      m = (tmat4x4<float,_(glm::precision)0> *)cubePositions;
      for (uVar12 = 0; uVar12 != 10; uVar12 = uVar12 + 1) {
        model.value[0].field_0.field_0.x = 1.0;
        model.value[0].field_0.field_0.y = 0.0;
        model.value[0].field_0.field_0.z = 0.0;
        model.value[0].field_0.field_0.w = 0.0;
        model.value[1].field_0.field_0.x = 0.0;
        model.value[1].field_0.field_0.y = 1.0;
        model.value[1].field_0._8_8_ = 0;
        model.value[2].field_0._0_8_ = 0;
        model.value[2].field_0.field_0.z = 1.0;
        model.value[2].field_0.field_0.w = 0.0;
        model.value[3].field_0.field_0.x = 0.0;
        model.value[3].field_0.field_0.y = 0.0;
        model.value[3].field_0.field_0.z = 0.0;
        model.value[3].field_0.field_0.w = 1.0;
        glm::translate<float,(glm::precision)0>
                  ((tmat4x4<float,_(glm::precision)0> *)&local_8f8,(glm *)&model,m,pvVar10);
        model.value[3].field_0.field_0.x = local_8c8;
        model.value[3].field_0.field_0.y = fStack_8c4;
        model.value[3].field_0.field_0.z = fStack_8c0;
        model.value[3].field_0.field_0.w = fStack_8bc;
        model.value[2].field_0.field_0.z = fStack_8d0;
        model.value[2].field_0.field_0.w = fStack_8cc;
        model.value[1].field_0.field_0.x = (float)local_8e8;
        model.value[1].field_0.field_0.y = (float)((ulong)local_8e8 >> 0x20);
        model.value[1].field_0._8_8_ = uStack_8e0;
        model.value[0].field_0.field_0.x = local_8f8;
        model.value[0].field_0.field_0.y = fStack_8f4;
        model.value[0].field_0.field_0.z = fStack_8f0;
        model.value[0].field_0.field_0.w = fStack_8ec;
        fVar14 = (float)(int)uVar12 * 20.0;
        if (uVar12 == (uint)s1) {
          dVar1 = (double)glfwGetTime();
          fVar14 = (float)(dVar1 * 25.0);
        }
        local_908 = 0x3e99999a3f800000;
        local_900 = 0x3f000000;
        glm::rotate<float,(glm::precision)0>
                  ((tmat4x4<float,_(glm::precision)0> *)&local_8f8,(glm *)&model,
                   (tmat4x4<float,_(glm::precision)0> *)&local_908,fVar14 * 0.017453292,pvVar10);
        model.value[1].field_0.field_0.x = (float)local_8e8;
        model.value[1].field_0.field_0.y = (float)((ulong)local_8e8 >> 0x20);
        model.value[1].field_0._8_8_ = uStack_8e0;
        model.value[0].field_0.field_0.x = local_8f8;
        model.value[0].field_0.field_0.y = fStack_8f4;
        model.value[0].field_0.field_0.z = fStack_8f0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_8f8,"model",(allocator<char> *)&local_908);
        Shader::setMat4(&shader,(string *)&local_8f8,&model);
        std::__cxx11::string::~string((string *)&local_8f8);
        (*gl3wDrawArrays)(4,0,0x24);
        m = (tmat4x4<float,_(glm::precision)0> *)((long)&m->value[0].field_0 + 0xc);
      }
      ImGui::Render();
      pGVar5 = local_950;
      glfwSwapBuffers(local_950);
      glfwPollEvents();
    }
    ImGui_ImplGlfwGL3_Shutdown();
    (*gl3wDeleteVertexArrays)(1,&VAO);
    (*gl3wDeleteBuffers)(1,&VBO);
    glfwTerminate();
    Shader::~Shader(&shader);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int main(int, char**)
{
    // Setup window
    char path[1024];
    bool show_another_window = true;

    GLuint ID;
    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
      return 1;

    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 3);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 3);
    glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);
#if __APPLE__
    glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GL_TRUE);
#endif
    GLFWwindow* window = glfwCreateWindow(SCR_WIDTH, SCR_HEIGHT, "ImGui GLFW example 09", NULL, NULL);
    glfwMakeContextCurrent(window);
    glfwSetFramebufferSizeCallback(window, framebuffer_size_callback);
    glfwSetCursorPosCallback(window, mouse_callback);
    glfwSetScrollCallback(window, scroll_callback);

    // tell GLFW to capture our mouse
    glfwSetInputMode(window, GLFW_CURSOR, GLFW_CURSOR_DISABLED);

    gl3wInit();
    glEnable(GL_DEPTH_TEST);

    int nrAttributes;
    glGetIntegerv(GL_MAX_VERTEX_ATTRIBS, &nrAttributes);
    std::cout << "Maximum nr of vertex attributes supported: " << nrAttributes << std::endl;

    // Setup ImGui binding
    ImGui_ImplGlfwGL3_Init(window, true);

    ImVec4 clear_color = ImColor(114, 144, 154);

    // ------------------------------------
    // vertex shader
    getcwd((char*)path,1023);
    Shader shader;
    shader.loadVS(path);
    shader.loadFS(path);
    shader.build();

    // set up vertex data (and buffer(s)) and configure vertex attributes
    // ------------------------------------------------------------------
    float vertices[] = {
        -0.5f, -0.5f, -0.5f,  0.0f, 0.0f,
         0.5f, -0.5f, -0.5f,  1.0f, 0.0f,
         0.5f,  0.5f, -0.5f,  1.0f, 1.0f,
         0.5f,  0.5f, -0.5f,  1.0f, 1.0f,
        -0.5f,  0.5f, -0.5f,  0.0f, 1.0f,
        -0.5f, -0.5f, -0.5f,  0.0f, 0.0f,

        -0.5f, -0.5f,  0.5f,  0.0f, 0.0f,
         0.5f, -0.5f,  0.5f,  1.0f, 0.0f,
         0.5f,  0.5f,  0.5f,  1.0f, 1.0f,
         0.5f,  0.5f,  0.5f,  1.0f, 1.0f,
        -0.5f,  0.5f,  0.5f,  0.0f, 1.0f,
        -0.5f, -0.5f,  0.5f,  0.0f, 0.0f,

        -0.5f,  0.5f,  0.5f,  1.0f, 0.0f,
        -0.5f,  0.5f, -0.5f,  1.0f, 1.0f,
        -0.5f, -0.5f, -0.5f,  0.0f, 1.0f,
        -0.5f, -0.5f, -0.5f,  0.0f, 1.0f,
        -0.5f, -0.5f,  0.5f,  0.0f, 0.0f,
        -0.5f,  0.5f,  0.5f,  1.0f, 0.0f,

         0.5f,  0.5f,  0.5f,  1.0f, 0.0f,
         0.5f,  0.5f, -0.5f,  1.0f, 1.0f,
         0.5f, -0.5f, -0.5f,  0.0f, 1.0f,
         0.5f, -0.5f, -0.5f,  0.0f, 1.0f,
         0.5f, -0.5f,  0.5f,  0.0f, 0.0f,
         0.5f,  0.5f,  0.5f,  1.0f, 0.0f,

        -0.5f, -0.5f, -0.5f,  0.0f, 1.0f,
         0.5f, -0.5f, -0.5f,  1.0f, 1.0f,
         0.5f, -0.5f,  0.5f,  1.0f, 0.0f,
         0.5f, -0.5f,  0.5f,  1.0f, 0.0f,
        -0.5f, -0.5f,  0.5f,  0.0f, 0.0f,
        -0.5f, -0.5f, -0.5f,  0.0f, 1.0f,

        -0.5f,  0.5f, -0.5f,  0.0f, 1.0f,
         0.5f,  0.5f, -0.5f,  1.0f, 1.0f,
         0.5f,  0.5f,  0.5f,  1.0f, 0.0f,
         0.5f,  0.5f,  0.5f,  1.0f, 0.0f,
        -0.5f,  0.5f,  0.5f,  0.0f, 0.0f,
        -0.5f,  0.5f, -0.5f,  0.0f, 1.0f
    };
    // world space positions of our cubes
    glm::vec3 cubePositions[] = {
        glm::vec3( 0.0f,  0.0f,  0.0f),
        glm::vec3( 2.0f,  5.0f, -15.0f),
        glm::vec3(-1.5f, -2.2f, -2.5f),
        glm::vec3(-3.8f, -2.0f, -12.3f),
        glm::vec3( 2.4f, -0.4f, -3.5f),
        glm::vec3(-1.7f,  3.0f, -7.5f),
        glm::vec3( 1.3f, -2.0f, -2.5f),
        glm::vec3( 1.5f,  2.0f, -2.5f),
        glm::vec3( 1.5f,  0.2f, -1.5f),
        glm::vec3(-1.3f,  1.0f, -1.5f)
    };
    unsigned int VBO, VAO;
    glGenVertexArrays(1, &VAO);
    glGenBuffers(1, &VBO);

    glBindVertexArray(VAO);

    glBindBuffer(GL_ARRAY_BUFFER, VBO);
    glBufferData(GL_ARRAY_BUFFER, sizeof(vertices), vertices, GL_STATIC_DRAW);

    // position attribute
    glVertexAttribPointer(0, 3, GL_FLOAT, GL_FALSE, 5 * sizeof(float), (void*)0);
    glEnableVertexAttribArray(0);
    // texture coord attribute
    glVertexAttribPointer(1, 2, GL_FLOAT, GL_FALSE, 5 * sizeof(float), (void*)(3 * sizeof(float)));
    glEnableVertexAttribArray(1);


    // load and create a texture
    // -------------------------
    unsigned int texture1, texture2;
    // texture 1
    // ---------
    glGenTextures(1, &texture1);
    glBindTexture(GL_TEXTURE_2D, texture1);
    // set the texture wrapping parameters
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT);
    // set texture filtering parameters
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
    // load image, create texture and generate mipmaps
    int width, height, nrChannels;
    stbi_set_flip_vertically_on_load(true); // tell stb_image.h to flip loaded texture's on the y-axis.


    getcwd((char*)path,1023);
    strcat((char*)path,"/container.jpg");
    printf("path[%s]\n",(char*)path);
    unsigned char *data = stbi_load((char*)path, &width, &height, &nrChannels, 0);
    if (data){
      glTexImage2D(GL_TEXTURE_2D, 0, GL_RGB, width, height, 0, GL_RGB, GL_UNSIGNED_BYTE, data);
      glGenerateMipmap(GL_TEXTURE_2D);
    }
    else{
        std::cout << "Failed to load texture" << std::endl;
    }
    stbi_image_free(data);
    // texture 2
    // ---------
    glGenTextures(1, &texture2);
    glBindTexture(GL_TEXTURE_2D, texture2);
    // set the texture wrapping parameters
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT);
    // set texture filtering parameters
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
    // load image, create texture and generate mipmaps
    getcwd((char*)path,1023);
    strcat((char*)path,"/awesomeface.png");
    printf("path[%s]\n",(char*)path);
    data = stbi_load((char*)path, &width, &height, &nrChannels, 0);
    if (data){
        // note that the awesomeface.png has transparency and thus an alpha channel, so make sure to tell OpenGL the data type is of GL_RGBA
        glTexImage2D(GL_TEXTURE_2D, 0, GL_RGB, width, height, 0, GL_RGBA, GL_UNSIGNED_BYTE, data);
        glGenerateMipmap(GL_TEXTURE_2D);
    }
    else{
        std::cout << "Failed to load texture" << std::endl;
    }
    stbi_image_free(data);

    shader.use();
    shader.setInt("texture1", 0);
    shader.setInt("texture2", 1);
    //// END VERTEX
    while (!glfwWindowShouldClose(window)){

        float currentFrame = glfwGetTime();
        deltaTime = currentFrame - lastFrame;
        lastFrame = currentFrame;
        processInput(window);

        ImGui_ImplGlfwGL3_NewFrame();
        // 1. Show a simple window
        if (show_another_window){
            ImGui::SetNextWindowSize(ImVec2(200,100), ImGuiSetCond_FirstUseEver);
            ImGui::Begin("Another Window", &show_another_window);
            ShowAnotherWindow();
            ImGui::End();
        }
        // render
        // ------
        glClearColor(0.2f, 0.3f, 0.3f, 1.0f);
        glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT); // also clear the depth buffer now!

         // bind textures on corresponding texture units
        glActiveTexture(GL_TEXTURE0);
        glBindTexture(GL_TEXTURE_2D, texture1);
        glActiveTexture(GL_TEXTURE1);
        glBindTexture(GL_TEXTURE_2D, texture2);

        // activate shader
        shader.use();

        // create transformations
        glm::mat4 projection = glm::perspective(glm::radians(fov), (float)SCR_WIDTH / (float)SCR_HEIGHT, 0.1f, 100.0f);
        glm::mat4 view = glm::lookAt(cameraPos, cameraPos + cameraFront, cameraUp);
        shader.setMat4("projection", projection);
        shader.setMat4("view", view);

        // render boxes
        glBindVertexArray(VAO);
        for (unsigned int i = 0; i < 10; i++)
        {
            // calculate the model matrix for each object and pass it to shader before drawing
            glm::mat4 model;
            model = glm::translate(model, cubePositions[i]);
            float angle = 20.0f * i;
            //model = glm::rotate(model, glm::radians(angle), glm::vec3(1.0f, 0.3f, 0.5f));
            //model = glm::rotate(model, (float)glfwGetTime() * glm::radians(50.0f), glm::vec3(0.5f, 1.0f, 0.0f));
            //glUniformMatrix4fv(glGetUniformLocation(shader.getpID(), "model"), 1, GL_FALSE, &model[0][0]);
            if(s1!=-1){  // every 3rd iteration (including the first) we set the angle using GLFW's time function.
              if(i==s1)
                angle = glfwGetTime() * 25.0f;
            }
            model = glm::rotate(model, glm::radians(angle), glm::vec3(1.0f, 0.3f, 0.5f));
            shader.setMat4("model", model);
            glDrawArrays(GL_TRIANGLES, 0, 36);
        }

        ImGui::Render();
        glfwSwapBuffers(window);
        glfwPollEvents();
    }

    // Cleanup
    ImGui_ImplGlfwGL3_Shutdown();

    glDeleteVertexArrays(1, &VAO);
    glDeleteBuffers(1, &VBO);

    glfwTerminate();
    return 0;
}